

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

Iterator * __thiscall
kj::_::BTreeImpl::search(Iterator *__return_storage_ptr__,BTreeImpl *this,SearchKey *searchKey)

{
  NodeUnion *pNVar1;
  NodeUnion *tree;
  bool bVar2;
  uint uVar3;
  uint row;
  Leaf *leaf;
  Parent *parent;
  Iterator local_38;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_int> *__range2;
  uint pos;
  SearchKey *searchKey_local;
  BTreeImpl *this_local;
  
  __range2._4_4_ = 0;
  ___end2 = zeroTo<unsigned_int>(this->height);
  i = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end2);
  local_38 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end2);
  while( true ) {
    bVar2 = Range<unsigned_int>::Iterator::operator!=((Iterator *)&i,&local_38);
    if (!bVar2) break;
    Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
    pNVar1 = this->tree;
    uVar3 = (**searchKey->_vptr_SearchKey)(searchKey,pNVar1 + __range2._4_4_);
    __range2._4_4_ = *(uint *)((long)&pNVar1[__range2._4_4_].field_0 + (ulong)uVar3 * 4 + 0x20);
    Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
  }
  pNVar1 = this->tree;
  tree = this->tree;
  row = (*searchKey->_vptr_SearchKey[1])(searchKey,(Leaf *)(pNVar1 + __range2._4_4_));
  Iterator::Iterator(__return_storage_ptr__,tree,(Leaf *)(pNVar1 + __range2._4_4_),row);
  return __return_storage_ptr__;
}

Assistant:

BTreeImpl::Iterator BTreeImpl::search(const SearchKey& searchKey) const {
  // Find the "first" row number (in sorted order) for which searchKey.isAfter(rowNumber) returns
  // false.

  uint pos = 0;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    auto& parent = tree[pos].parent;
    pos = parent.children[searchKey.search(parent)];
  }

  auto& leaf = tree[pos].leaf;
  return { tree, &leaf, searchKey.search(leaf) };
}